

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

shared_ptr<const_libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_file(torrent *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<const_libtorrent::torrent_info> sVar3;
  shared_ptr<const_libtorrent::torrent_info> sVar4;
  shared_ptr<const_libtorrent::torrent_info> sVar5;
  
  peVar1 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->m_files).m_piece_length < 1) {
    (in_RDI->m_files).m_piece_length = 0;
    (in_RDI->m_files).m_num_pieces = 0;
    *(undefined8 *)&(in_RDI->m_files).m_v2 = 0;
    sVar4.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = in_RDX._M_pi;
    sVar4.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         in_RDI;
    return (shared_ptr<const_libtorrent::torrent_info>)
           sVar4.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
  }
  *(element_type **)&in_RDI->m_files = peVar1;
  p_Var2 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(in_RDI->m_files).m_v2 = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      sVar3.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar3.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (shared_ptr<const_libtorrent::torrent_info>)
             sVar3.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  sVar5.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar5.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<const_libtorrent::torrent_info>)
         sVar5.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const torrent_info> torrent::get_torrent_file() const
	{
		if (!m_torrent_file->is_valid()) return {};
		return m_torrent_file;
	}